

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

bool NscPushDefaultValue(CNscPStackEntry *pOut,NscType nType)

{
  switch(nType) {
  case NscType_Integer:
    CNscPStackEntry::PushConstantInteger(pOut,0);
    if (pOut->m_nType == NscType_Unknown) {
      pOut->m_nType = NscType_Integer;
      return true;
    }
    break;
  case NscType_Float:
    CNscPStackEntry::PushConstantFloat(pOut,0.0);
    if (pOut->m_nType == NscType_Unknown) {
      pOut->m_nType = NscType_Float;
      return true;
    }
    break;
  case NscType_String:
    CNscPStackEntry::PushConstantString(pOut,"",0);
    if (pOut->m_nType == NscType_Unknown) {
      pOut->m_nType = NscType_String;
      return true;
    }
    break;
  case NscType_Object:
    CNscPStackEntry::PushConstantObject(pOut,1);
    if (pOut->m_nType == NscType_Unknown) {
      pOut->m_nType = NscType_Object;
      return true;
    }
    break;
  case NscType_Vector:
    CNscPStackEntry::PushConstantVector(pOut,0.0,0.0,0.0);
    if (pOut->m_nType == NscType_Unknown) {
      pOut->m_nType = NscType_Vector;
      return true;
    }
    break;
  case NscType_Engine_2:
    CNscPStackEntry::PushConstantLocation(pOut,0);
    if (pOut->m_nType == NscType_Unknown) {
      pOut->m_nType = NscType_Engine_2;
      return true;
    }
    break;
  default:
    if (nType == NscType_Engine_7) {
      CNscPStackEntry::PushConstantJson(pOut,"",-1);
      if (pOut->m_nType == NscType_Unknown) {
        pOut->m_nType = NscType_Engine_7;
        return true;
      }
      break;
    }
  case NscType_Vector|NscType_Void:
  case NscType_String|NscType_Statement:
  case NscType_String|NscType_Struct:
  case NscType_String|NscType_Integer:
  case NscType_String|NscType_Float:
  case NscType_Engine_0:
  case NscType_Engine_1:
    if (((int)nType < 0x20) || (g_pCtx->m_nStructs <= (int)(nType - NscType_Struct_0))) {
      if (pOut->m_nType == NscType_Unknown) {
        pOut->m_nType = NscType_Error;
        return false;
      }
    }
    else {
      CNscPStackEntry::PushConstantStructure(pOut,nType);
      if (pOut->m_nType == NscType_Unknown) {
        pOut->m_nType = nType;
        return true;
      }
    }
  }
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

bool NscPushDefaultValue (CNscPStackEntry *pOut, NscType nType)
{
	switch (nType)
	{

		case NscType_Integer:
			pOut ->PushConstantInteger (0);
			pOut ->SetType (NscType_Integer);
			return true;

		case NscType_Float:
			pOut ->PushConstantFloat (0.0f);
			pOut ->SetType (NscType_Float);
			return true;

		case NscType_String:
			pOut ->PushConstantString ("", 0);
			pOut ->SetType (NscType_String);
			return true;

		case NscType_Engine_2:
			pOut ->PushConstantLocation(LOCATION_PRESET_INVALID);
			pOut ->SetType (NscType_Engine_2);
			return true;

		case NscType_Engine_7:
			pOut ->PushConstantJson ("");
			pOut ->SetType (NscType_Engine_7);
			return true;

		case NscType_Object:
			pOut ->PushConstantObject (1); // OBJECT_INVALID
			pOut ->SetType (NscType_Object);
			return true;

		case NscType_Vector:
			pOut ->PushConstantVector (0.0f, 0.0f, 0.0f);
			pOut ->SetType (NscType_Vector);
			return true;

		default:

			//
			// If this is a structure type
			//

			if (g_pCtx ->IsStructure (nType))
			{
				pOut ->PushConstantStructure (nType);
				pOut ->SetType (nType);
				return true;
			}

			pOut ->SetType (NscType_Error);
			return false;

	}
}